

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPool.cpp
# Opt level: O3

Ptr<CommandPool> __thiscall
myvk::CommandPool::Create(CommandPool *this,Ptr<Queue> *queue,VkCommandPoolCreateFlags flags)

{
  element_type *peVar1;
  PFN_vkCreateCommandPool p_Var2;
  int iVar3;
  VkResult VVar4;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Ptr<CommandPool> PVar6;
  _func_int **local_58;
  element_type *peStack_50;
  VkCommandPoolCreateInfo local_48;
  
  std::__shared_ptr<myvk::CommandPool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::CommandPool>>
            ((__shared_ptr<myvk::CommandPool,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (allocator<myvk::CommandPool> *)&local_48);
  local_58[3] = (_func_int *)
                (queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 4),
             &(queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  p_Var2 = vkCreateCommandPool;
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_48._4_4_ = 0;
  peVar1 = (queue->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.queueFamilyIndex =
       ((peVar1->m_unique_queue_ptr).
        super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_family_index;
  local_48.flags = flags;
  iVar3 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar4 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar3) + 0x268),&local_48,
                    (VkAllocationCallbacks *)0x0,(VkCommandPool *)(local_58 + 5));
  _Var5._M_pi = extraout_RDX;
  if (VVar4 == VK_SUCCESS) {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_58;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_50;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    if (peStack_50 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<CommandPool>)PVar6.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<CommandPool> CommandPool::Create(const Ptr<Queue> &queue, VkCommandPoolCreateFlags flags) {
	auto ret = std::make_shared<CommandPool>();
	ret->m_queue_ptr = queue;

	VkCommandPoolCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
	create_info.queueFamilyIndex = queue->GetFamilyIndex();
	create_info.flags = flags;
	if (vkCreateCommandPool(queue->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_command_pool) !=
	    VK_SUCCESS)
		return nullptr;
	return ret;
}